

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O3

ssize_t __thiscall VCProjectWriter::write(VCProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  char *pcVar1;
  int iVar2;
  QArrayData *pQVar3;
  QArrayData *pQVar4;
  QArrayData *pQVar5;
  Data *pDVar6;
  XmlOutput *pXVar7;
  char *pcVar8;
  undefined4 in_register_00000034;
  storage_type *psVar9;
  long in_FS_OFFSET;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  xml_output local_118;
  xml_output local_e0;
  xml_output local_a8;
  xml_output local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar10.m_data = (storage_type *)0x4;
  QVar10.m_size = (qsizetype)&local_70;
  QString::fromUtf8(QVar10);
  local_70.xo_text.d.size = (qsizetype)local_70.xo_text.d.ptr;
  pQVar5 = (QArrayData *)CONCAT44(local_70._4_4_,local_70.xo_type);
  local_70.xo_type = tTag;
  local_70.xo_text.d.ptr = (char16_t *)local_70.xo_text.d.d;
  if (pQVar5 != (QArrayData *)0x0) {
    LOCK();
    (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_70.xo_value.d.d = (Data *)0x0;
  local_70.xo_value.d.ptr = (char16_t *)0x0;
  local_70.xo_value.d.size = 0;
  local_70.xo_text.d.d = (Data *)pQVar5;
  pXVar7 = XmlOutput::operator<<((XmlOutput *)CONCAT44(in_register_00000034,__fd),&local_70);
  QVar11.m_data = (storage_type *)0xe;
  QVar11.m_size = (qsizetype)&local_a8;
  QString::fromUtf8(QVar11);
  local_a8.xo_value.d.size = (qsizetype)local_a8.xo_text.d.ptr;
  local_a8.xo_value.d.ptr = (char16_t *)local_a8.xo_text.d.d;
  pQVar4 = (QArrayData *)CONCAT44(local_a8._4_4_,local_a8.xo_type);
  if (local_a8.xo_text.d.ptr == (char16_t *)0x0) {
    local_a8.xo_type = tNothing;
    local_a8.xo_text.d.d = (Data *)0x0;
    local_a8.xo_text.d.ptr = (char16_t *)0x0;
    local_a8.xo_text.d.size = 0;
    local_a8.xo_value.d.d = (Data *)0x0;
    local_a8.xo_value.d.ptr = (char16_t *)0x0;
    local_a8.xo_value.d.size = 0;
  }
  else {
    QVar12.m_data = (storage_type *)0x4;
    QVar12.m_size = (qsizetype)&local_a8;
    QString::fromUtf8(QVar12);
    local_a8.xo_text.d.size = (qsizetype)local_a8.xo_text.d.ptr;
    pQVar3 = (QArrayData *)CONCAT44(local_a8._4_4_,local_a8.xo_type);
    local_a8.xo_type = tAttribute;
    local_a8.xo_text.d.ptr = (char16_t *)local_a8.xo_text.d.d;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_a8.xo_text.d.d = (Data *)pQVar3;
    local_a8.xo_value.d.d = (Data *)pQVar4;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar7 = XmlOutput::operator<<(pXVar7,&local_a8);
  iVar2 = *(int *)((long)__buf + 8);
  if (iVar2 == -1) {
    local_e0.xo_type = tNothing;
    local_e0.xo_text.d.d = (Data *)0x0;
    local_e0.xo_text.d.ptr = (char16_t *)0x0;
    local_e0.xo_text.d.size = 0;
    local_e0.xo_value.d.d = (Data *)0x0;
    local_e0.xo_value.d.ptr = (char16_t *)0x0;
    local_e0.xo_value.d.size = 0;
  }
  else {
    QVar13.m_data = (storage_type *)0xd;
    QVar13.m_size = (qsizetype)&local_e0;
    QString::fromUtf8(QVar13);
    local_e0.xo_text.d.size = (qsizetype)local_e0.xo_text.d.ptr;
    pDVar6 = local_e0.xo_text.d.d;
    pQVar3 = (QArrayData *)CONCAT44(local_e0._4_4_,local_e0.xo_type);
    pcVar8 = "false";
    if (iVar2 == 1) {
      pcVar8 = "true";
    }
    psVar9 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar9 + (long)(pcVar8 + 1);
      psVar9 = psVar9 + 1;
    } while (*pcVar1 != '\0');
    QVar14.m_data = psVar9;
    QVar14.m_size = (qsizetype)&local_e0;
    QString::fromUtf8(QVar14);
    local_e0.xo_value.d.size = (qsizetype)local_e0.xo_text.d.ptr;
    local_e0.xo_value.d.d = (Data *)CONCAT44(local_e0._4_4_,local_e0.xo_type);
    local_e0.xo_type = tAttribute;
    local_e0.xo_text.d.ptr = (char16_t *)pDVar6;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_e0.xo_value.d.ptr = (char16_t *)local_e0.xo_text.d.d;
    local_e0.xo_text.d.d = (Data *)pQVar3;
    if ((QArrayData *)local_e0.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_e0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_e0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_e0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_e0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if ((((QArrayData *)local_e0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate((QArrayData *)local_e0.xo_value.d.d,2,0x10);
      }
    }
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar7 = XmlOutput::operator<<(pXVar7,&local_e0);
  QVar15.m_data = (storage_type *)0x4;
  QVar15.m_size = (qsizetype)&local_118;
  QString::fromUtf8(QVar15);
  local_118.xo_text.d.size = (qsizetype)local_118.xo_text.d.ptr;
  pQVar3 = (QArrayData *)CONCAT44(local_118._4_4_,local_118.xo_type);
  local_118.xo_type = tCloseTag;
  local_118.xo_text.d.ptr = (char16_t *)local_118.xo_text.d.d;
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_118.xo_value.d.d = (Data *)0x0;
  local_118.xo_value.d.ptr = (char16_t *)0x0;
  local_118.xo_value.d.size = 0;
  local_118.xo_text.d.d = (Data *)pQVar3;
  XmlOutput::operator<<(pXVar7,&local_118);
  if (&(local_118.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_118.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_118.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_118.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_118.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_118.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,2,0x10);
    }
  }
  if (&(local_e0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_e0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_e0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_a8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_a8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,2,0x10);
    }
  }
  if (&(local_70.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_70.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_70.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_70.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_70.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_70.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar5 != (QArrayData *)0x0) {
    LOCK();
    (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar5,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void VCProjectWriter::write(XmlOutput &xml, const VCManifestTool &tool)
{
    xml << tag(_Tool)
        << attrS(_Name, _VCManifestTool)
        << attrT(_EmbedManifest, tool.EmbedManifest)
        << closetag(_Tool);
}